

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_entity_sets.cc
# Opt level: O3

CodimMeshDataSet<bool> *
lf::mesh::utils::flagEntitiesOnBoundary
          (CodimMeshDataSet<bool> *__return_storage_ptr__,shared_ptr<const_lf::mesh::Mesh> *mesh_p,
          dim_t codim)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  element_type *peVar4;
  Entity *e;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  uint *puVar8;
  undefined4 extraout_var_00;
  bool *pbVar9;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar10;
  CodimMeshDataSet<unsigned_int> no_adjacent_cells;
  string local_228;
  string local_208;
  string local_1e8;
  shared_ptr<const_lf::mesh::Mesh> local_1c8;
  undefined1 local_1b8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  pointer local_1a0;
  stored_size_type local_190;
  undefined8 *puVar7;
  
  if (codim != 0) {
    uVar5 = (**((mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->_vptr_Mesh)();
    if (codim <= uVar5) {
      CountNumSuperEntities((CodimMeshDataSet<unsigned_int> *)local_1b8,mesh_p,1,1);
      local_1c8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_1c8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
      if (local_1c8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1c8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_1c8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1c8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_1c8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      CodimMeshDataSet<bool>::CodimMeshDataSet(__return_storage_ptr__,&local_1c8,codim,false);
      if (local_1c8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1c8.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      peVar4 = (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      iVar6 = (*peVar4->_vptr_Mesh[2])(peVar4,1);
      puVar7 = (undefined8 *)CONCAT44(extraout_var,iVar6);
      if (extraout_RDX != 0) {
        puVar1 = puVar7 + extraout_RDX;
        do {
          e = (Entity *)*puVar7;
          puVar8 = CodimMeshDataSet<unsigned_int>::operator()
                             ((CodimMeshDataSet<unsigned_int> *)local_1b8,e);
          if (*puVar8 == 1) {
            iVar6 = (*e->_vptr_Entity[1])(e,(ulong)(codim - 1));
            if (extraout_RDX_00 != 0) {
              lVar10 = 0;
              do {
                pbVar9 = CodimMeshDataSet<bool>::operator()
                                   (__return_storage_ptr__,
                                    *(Entity **)(CONCAT44(extraout_var_00,iVar6) + lVar10));
                *pbVar9 = true;
                lVar10 = lVar10 + 8;
              } while (extraout_RDX_00 << 3 != lVar10);
            }
          }
          puVar7 = puVar7 + 1;
        } while (puVar7 != puVar1);
      }
      local_1b8._0_8_ = &PTR_operator___00492c98;
      if (local_190 != 0) {
        operator_delete(local_1a0,local_190 << 2);
      }
      if (local_1a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8._M_pi);
      }
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Illegal codim = ",0x10);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  paVar2 = &local_208.field_2;
  local_208._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,"(codim > 0) && (codim <= mesh_p->DimMesh())","");
  paVar3 = &local_228.field_2;
  local_228._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/special_entity_sets.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_208,&local_228,0x2b,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar3) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_208._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
  local_228._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/special_entity_sets.cc"
             ,"");
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"");
  base::AssertionFailed(&local_208,&local_228,0x2b,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  abort();
}

Assistant:

CodimMeshDataSet<bool> flagEntitiesOnBoundary(
    const std::shared_ptr<const Mesh>& mesh_p, lf::base::dim_t codim) {
  LF_ASSERT_MSG((codim > 0) && (codim <= mesh_p->DimMesh()),
                "Illegal codim = " << codim);
  // count cells adjacent to entities of co-dimension 1
  CodimMeshDataSet<lf::base::size_type> no_adjacent_cells{
      CountNumSuperEntities(mesh_p, 1, 1)};
  // flag array
  CodimMeshDataSet<bool> bd_flags{mesh_p, codim, false};
  // relative codimension with respect to faces (entities of co-dimension 1)
  const lf::base::dim_t rel_codim = codim - 1;
  // Run through  faces and flag sub-entities
  for (const lf::mesh::Entity* edge : mesh_p->Entities(1)) {
    if (no_adjacent_cells(*edge) == 1) {
      // Boundary face detected!
      // Traverse all sub-entities of a specific relative co-dimension
      for (const lf::mesh::Entity* subent : edge->SubEntities(rel_codim)) {
        bd_flags(*subent) = true;
      }
    }
  }
  return bd_flags;
}